

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScenePrivate::_q_processDirtyItems(QGraphicsScenePrivate *this)

{
  uint uVar1;
  uint uVar2;
  QGraphicsItem **ppQVar3;
  long lVar4;
  QGraphicsView **ppQVar5;
  bool bVar6;
  long lVar7;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)&this->field_0xb8;
  *(uint *)&this->field_0xb8 = uVar1 & 0xffffffef;
  if ((uVar1 & 4) == 0) {
    local_58.xp = (this->growingItemsBoundingRect).xp;
    local_58.yp = (this->growingItemsBoundingRect).yp;
    local_58.w = (this->growingItemsBoundingRect).w;
    local_58.h = (this->growingItemsBoundingRect).h;
    ppQVar3 = (this->topLevelItems).d.ptr;
    lVar4 = (this->topLevelItems).d.size;
    for (lVar7 = 0; lVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
      processDirtyItemsRecursive(this,*(QGraphicsItem **)((long)ppQVar3 + lVar7),false,1.0);
    }
    uVar2 = *(uint *)&this->field_0xb8;
    *(uint *)&this->field_0xb8 = uVar2 & 0xfffffffd;
    if ((uVar2 & 1) == 0) {
      bVar6 = ::operator!=(&local_58,&this->growingItemsBoundingRect);
      if (bVar6) {
        QGraphicsScene::sceneRectChanged
                  (*(QGraphicsScene **)&this->field_0x8,&this->growingItemsBoundingRect);
      }
    }
    if ((uVar1 & 8) == 0) {
      ppQVar5 = (this->views).d.ptr;
      lVar4 = (this->views).d.size;
      for (lVar7 = 0; lVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
        QGraphicsViewPrivate::processPendingUpdates
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar5 + lVar7) + 8));
      }
      if ((this->field_0xb8 & 8) != 0) {
        _q_emitUpdated(this);
      }
      ppQVar5 = (this->views).d.ptr;
      lVar4 = (this->views).d.size;
      for (lVar7 = 0; lVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
        QGraphicsViewPrivate::dispatchPendingUpdateRequests
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar5 + lVar7) + 8));
      }
    }
  }
  else {
    ppQVar3 = (this->topLevelItems).d.ptr;
    lVar4 = (this->topLevelItems).d.size;
    for (lVar7 = 0; lVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
      resetDirtyItem(this,*(QGraphicsItem **)((long)ppQVar3 + lVar7),true);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::_q_processDirtyItems()
{
    processDirtyItemsEmitted = false;

    if (updateAll) {
        Q_ASSERT(calledEmitUpdated);
        // No need for further processing (except resetting the dirty states).
        // The growingItemsBoundingRect is updated in _q_emitUpdated.
        for (auto topLevelItem : std::as_const(topLevelItems))
            resetDirtyItem(topLevelItem, /*recursive=*/true);
        return;
    }

    const bool wasPendingSceneUpdate = calledEmitUpdated;
    const QRectF oldGrowingItemsBoundingRect = growingItemsBoundingRect;

    // Process items recursively.
    for (auto topLevelItem : std::as_const(topLevelItems))
        processDirtyItemsRecursive(topLevelItem);

    dirtyGrowingItemsBoundingRect = false;
    if (!hasSceneRect && oldGrowingItemsBoundingRect != growingItemsBoundingRect)
        emit q_func()->sceneRectChanged(growingItemsBoundingRect);

    if (wasPendingSceneUpdate)
        return;

    for (auto view : std::as_const(views))
        view->d_func()->processPendingUpdates();

    if (calledEmitUpdated) {
        // We did a compatibility QGraphicsScene::update in processDirtyItemsRecursive
        // and we cannot wait for the control to reach the eventloop before the
        // changed signal is emitted, so we emit it now.
        _q_emitUpdated();
    }

    // Immediately dispatch all pending update requests on the views.
    for (auto view : std::as_const(views))
        view->d_func()->dispatchPendingUpdateRequests();
}